

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NGramStorageTest.cpp
# Opt level: O3

void __thiscall
ngram_storage_check_content_check_Test::~ngram_storage_check_content_check_Test
          (ngram_storage_check_content_check_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ngram_storage_check, content_check) {
    vector<pair<vector<uint32_t>, uint32_t>> ngrams;

    for (int i = 0; i < 10000; i++) {
        vector<uint32_t> ngram;
        for (int j = 0; j < 3; j++)
            ngram.push_back(uint32_t(prng() % 26));
        ngrams.push_back(make_pair(ngram, prng() % 10 + 1));
    }

    NGramStorage storage(ngrams);
    NGramStorage storage2;
    storage2.loads(storage.dumps());

    for (uint32_t i = 0; i < ngrams.size(); i++) {
        vector<uint32_t> ngram = ngrams[i].first;
        for (uint32_t j = 0; j < ngrams[i].first.size(); j++) {
            ASSERT_EQ(storage2.get_ngram_count(ngram), get_ngram_count(ngrams, ngram));
            ASSERT_EQ(storage2.get_continuations_count(ngram), get_continuations_count(ngrams, ngram));
            ASSERT_EQ(storage2.get_unique_continuations_count(ngram), get_unique_continuations_count(ngrams, ngram));
            ngram.pop_back();
        }
    }

    for (int i = 0; i < 10000; i++) {
        vector<uint32_t> ngram;
        for (int j = 0; j < 3; j++) {
            ngram.push_back(uint32_t(prng() % 26));
            ASSERT_EQ(storage2.get_ngram_count(ngram), get_ngram_count(ngrams, ngram));
            ASSERT_EQ(storage2.get_continuations_count(ngram), get_continuations_count(ngrams, ngram));
            ASSERT_EQ(storage2.get_unique_continuations_count(ngram), get_unique_continuations_count(ngrams, ngram));
        }
    }
}